

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.cpp
# Opt level: O0

unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>
MetaSim::RandomVar::parsevar(string *str)

{
  size_type sVar1;
  genericFactory<MetaSim::RandomVar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  pointer pRVar2;
  undefined8 uVar3;
  string *in_RSI;
  _Head_base<0UL,_MetaSim::RandomVar_*,_false> in_RDI;
  string *in_stack_00000030;
  string *in_stack_00000038;
  ParseExc *in_stack_00000040;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parms;
  string p;
  string token;
  unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_> *var;
  unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>
  *in_stack_fffffffffffffe50;
  allocator *instr;
  undefined6 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb6;
  allocator in_stack_fffffffffffffeb7;
  string *in_stack_fffffffffffffeb8;
  ulong local_120;
  allocator local_111;
  string local_110 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  allocator local_d1;
  string local_d0 [14];
  char in_stack_ffffffffffffff3e;
  char in_stack_ffffffffffffff3f;
  string *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  string local_30 [48];
  
  instr = &local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"(",instr);
  parse_util::get_token((string *)instr,in_RSI);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"(",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,")",&local_d1);
  parse_util::get_param
            (in_stack_fffffffffffffeb8,
             (string *)
             CONCAT17(in_stack_fffffffffffffeb7,
                      CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)),(string *)instr
            );
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,",",&local_111);
  parse_util::split_param
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f,
             in_stack_ffffffffffffff3e);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  for (local_120 = 0;
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_f0), local_120 < sVar1; local_120 = local_120 + 1) {
  }
  this = genericFactory<MetaSim::RandomVar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::instance();
  genericFactory<MetaSim::RandomVar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::create((genericFactory<MetaSim::RandomVar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)instr,in_RSI,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDI._M_head_impl);
  pRVar2 = std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>::get
                     (in_stack_fffffffffffffe50);
  if (pRVar2 != (pointer)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_30);
    return (__uniq_ptr_data<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>,_true,_true>
           )(tuple<MetaSim::RandomVar_*,_std::default_delete<MetaSim::RandomVar>_>)
            in_RDI._M_head_impl;
  }
  uVar3 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffeb8,"parsevar",(allocator *)&stack0xfffffffffffffeb7);
  parse_util::ParseExc::ParseExc(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  __cxa_throw(uVar3,&parse_util::ParseExc::typeinfo,parse_util::ParseExc::~ParseExc);
}

Assistant:

unique_ptr<RandomVar> RandomVar::parsevar(const std::string &str)
    {
        string token = get_token(str);
        DBGPRINT_2("token = ",  token);
                
        string p = get_param(str);
        DBGPRINT_2("parms = ", p);

        vector<string> parms = split_param(p);
  
        for (size_t i = 0; i < parms.size(); ++i) 
            DBGPRINT_4("par[", i, "] = ", parms[i]);
                
        unique_ptr<RandomVar> var(FACT(RandomVar).create(token,parms));
                
        if (var.get() == nullptr) throw ParseExc("parsevar", str);
                                
        return var;
    }